

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O2

void __thiscall
obs::signal<void(int,int,double)>::operator()
          (signal<void(int,int,double)> *this,int *args,int *args_1,double *args_2)

{
  bool bVar1;
  slot<void_(int,_int,_double)> *this_00;
  iterator __end0;
  iterator __begin0;
  iterator iStack_78;
  iterator local_50;
  
  safe_list<obs::slot<void_(int,_int,_double)>_>::begin
            (&local_50,(safe_list<obs::slot<void_(int,_int,_double)>_> *)(this + 8));
  safe_list<obs::slot<void_(int,_int,_double)>_>::end
            (&iStack_78,(safe_list<obs::slot<void_(int,_int,_double)>_> *)(this + 8));
  while( true ) {
    bVar1 = safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::operator!=
                      (&local_50,&iStack_78);
    if (!bVar1) break;
    this_00 = safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::operator*(&local_50);
    if (this_00 != (slot<void_(int,_int,_double)> *)0x0) {
      slot<void(int,int,double)>::operator()
                ((slot<void(int,int,double)> *)this_00,args,args_1,args_2);
    }
    safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::operator++(&local_50);
  }
  safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::~iterator(&iStack_78);
  safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::~iterator(&local_50);
  return;
}

Assistant:

void operator()(Args2&&...args) {
    for (auto slot : m_slots)
      if (slot)
        (*slot)(std::forward<Args2>(args)...);
  }